

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::RenderCustomTexData(ImFontAtlas *this,int pass,void *p_rects)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  undefined8 uVar7;
  ImGuiContext *pIVar8;
  value_type *pvVar9;
  undefined8 *puVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  long lVar15;
  float fVar16;
  float fVar18;
  undefined1 auVar17 [16];
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  stbrp_rect r;
  value_type local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  if (pass == 1) {
    lVar15 = 0;
    pvVar9 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)p_rects,0);
    for (iVar11 = 0; iVar11 != 0x1b; iVar11 = iVar11 + 1) {
      for (lVar12 = 0; (int)lVar12 != 0x5a; lVar12 = lVar12 + 1) {
        cVar4 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                [(int)lVar15 + lVar12];
        lVar13 = (long)(int)((uint)pvVar9->x + (int)lVar12 +
                            ((uint)pvVar9->y + iVar11) * this->TexWidth);
        this->TexPixelsAlpha8[lVar13] = -(cVar4 == '.');
        this->TexPixelsAlpha8[lVar13 + 0x5b] = -(cVar4 == 'X');
      }
      lVar15 = (int)lVar15 + lVar12;
    }
    uVar2 = this->TexWidth;
    uVar3 = this->TexHeight;
    auVar17._4_2_ = SUB42((float)(int)uVar3,0);
    auVar17._0_4_ = (float)(int)uVar2;
    auVar17._6_2_ = (short)((uint)(float)(int)uVar3 >> 0x10);
    auVar17._8_8_ = 0;
    auVar17 = divps(_DAT_00155110,auVar17);
    uVar5._0_2_ = pvVar9->x;
    uVar5._2_2_ = pvVar9->y;
    fVar16 = auVar17._0_4_;
    IVar19.x = ((float)(uVar5 & 0xffff) + 0.5) * fVar16;
    fVar18 = auVar17._4_4_;
    IVar19.y = ((float)(uVar5 >> 0x10) + 0.5) * fVar18;
    this->TexUvWhitePixel = IVar19;
    puVar10 = &local_a8;
    local_b8.id = 0;
    local_b8.w = 0;
    local_b8.h = 0x4040;
    local_b8.x = 0;
    local_b8.y = 0x4140;
    local_b8.was_packed = 0x41980000;
    local_a8 = 0;
    uStack_a0 = 0x41500000;
    local_98 = 0x4180000040e00000;
    uStack_90 = 0x4100000040800000;
    local_88 = 0x41f80000;
    uStack_80 = 0x41b8000041b80000;
    local_78 = 0x4130000041300000;
    uStack_70 = 0x41a80000;
    local_68 = 0x41b8000041100000;
    uStack_60 = 0x4130000040a00000;
    local_58 = 0x41900000425c0000;
    uStack_50 = 0x4110000041b80000;
    local_48 = 0x40a0000041300000;
    uStack_40 = 0x42920000;
    local_38 = 0x4188000041880000;
    uStack_30 = 0x4110000041100000;
    local_28 = 0x425c0000;
    uStack_20 = 0x4188000041880000;
    local_18 = 0x4110000041100000;
    lVar15 = 0;
    for (lVar12 = 0; pIVar8 = GImGui, lVar12 != 7; lVar12 = lVar12 + 1) {
      *(int *)((long)GImGui->MouseCursorData[0].TexUvMin + lVar15 + -0x14) = (int)lVar12;
      uVar6._0_2_ = pvVar9->x;
      uVar6._2_2_ = pvVar9->y;
      fVar20 = (float)puVar10[-2] + (float)(uVar6 & 0xffff);
      fVar21 = (float)((ulong)puVar10[-2] >> 0x20) + (float)(uVar6 >> 0x10);
      *(undefined8 *)((long)&pIVar8->MouseCursorData[0].TexUvMin[-2].x + lVar15) = *puVar10;
      fVar22 = fVar18 * fVar21;
      *(ulong *)((long)&pIVar8->MouseCursorData[0].TexUvMin[0].x + lVar15) =
           CONCAT44(fVar22,fVar16 * fVar20);
      uVar7 = puVar10[-1];
      fVar14 = (float)uVar7;
      *(float *)((long)&pIVar8->MouseCursorData[0].TexUvMin[-1].x + lVar15) = fVar14;
      fVar23 = (float)((ulong)uVar7 >> 0x20);
      *(float *)((long)pIVar8->MouseCursorData[0].TexUvMin + lVar15 + -4) = fVar23;
      fVar23 = (fVar21 + fVar23) * fVar18;
      pfVar1 = (float *)((long)&pIVar8->MouseCursorData[0].TexUvMin[1].x + lVar15);
      *pfVar1 = fVar16 * (fVar20 + 91.0);
      pfVar1[1] = fVar22;
      pfVar1[2] = (fVar20 + fVar14) * fVar16;
      pfVar1[3] = fVar23;
      *(ulong *)((long)&pIVar8->MouseCursorData[0].TexUvMax[1].x + lVar15) =
           CONCAT44(fVar23,(fVar20 + 91.0 + fVar14) * fVar16);
      puVar10 = puVar10 + 3;
      lVar15 = lVar15 + 0x34;
    }
  }
  else if (pass == 0) {
    local_b8.x = 0;
    local_b8.y = 0;
    local_b8.was_packed = 0;
    local_b8.id = 0;
    local_b8.w = 0xb5;
    local_b8.h = 0x1c;
    ImVector<stbrp_rect>::push_back((ImVector<stbrp_rect> *)p_rects,&local_b8);
  }
  return;
}

Assistant:

void ImFontAtlas::RenderCustomTexData(int pass, void* p_rects)
{
    // A work of art lies ahead! (. = white layer, X = black layer, others are blank)
    // The white texels on the top left are the ones we'll use everywhere in ImGui to render filled shapes.
    const int TEX_DATA_W = 90;
    const int TEX_DATA_H = 27;
    const char texture_data[TEX_DATA_W*TEX_DATA_H+1] =
    {
        "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX"
        "..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X"
        "---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X"
        "X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X"
        "XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X"
        "X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X"
        "X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX"
        "X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      "
        "X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       "
        "X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        "
        "X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         "
        "X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          "
        "X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           "
        "X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            "
        "X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           "
        "X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          "
        "X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          "
        "X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------"
        "X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           "
        "XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -           "
        "      X..X          -  X...X  -         X...X         -  X..X           X..X  -           "
        "       XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           "
        "------------        -    X    -           X           -X.....................X-           "
        "                    ----------------------------------- X...XXXXXXXXXXXXX...X -           "
        "                                                      -  X..X           X..X  -           "
        "                                                      -   X.X           X.X   -           "
        "                                                      -    XX           XX    -           "
    };

    ImVector<stbrp_rect>& rects = *(ImVector<stbrp_rect>*)p_rects;
    if (pass == 0)
    {
        // Request rectangles
        stbrp_rect r;
        memset(&r, 0, sizeof(r));
        r.w = (TEX_DATA_W*2)+1;
        r.h = TEX_DATA_H+1;
        rects.push_back(r);
    }
    else if (pass == 1)
    {
        // Render/copy pixels
        const stbrp_rect& r = rects[0];
        for (int y = 0, n = 0; y < TEX_DATA_H; y++)
            for (int x = 0; x < TEX_DATA_W; x++, n++)
            {
                const int offset0 = (int)(r.x + x) + (int)(r.y + y) * TexWidth;
                const int offset1 = offset0 + 1 + TEX_DATA_W;
                TexPixelsAlpha8[offset0] = texture_data[n] == '.' ? 0xFF : 0x00;
                TexPixelsAlpha8[offset1] = texture_data[n] == 'X' ? 0xFF : 0x00;
            }
        const ImVec2 tex_uv_scale(1.0f / TexWidth, 1.0f / TexHeight);
        TexUvWhitePixel = ImVec2((r.x + 0.5f) * tex_uv_scale.x, (r.y + 0.5f) * tex_uv_scale.y);

        // Setup mouse cursors
        const ImVec2 cursor_datas[ImGuiMouseCursor_Count_][3] =
        {
            // Pos ........ Size ......... Offset ......
            { ImVec2(0,3),  ImVec2(12,19), ImVec2( 0, 0) }, // ImGuiMouseCursor_Arrow
            { ImVec2(13,0), ImVec2(7,16),  ImVec2( 4, 8) }, // ImGuiMouseCursor_TextInput
            { ImVec2(31,0), ImVec2(23,23), ImVec2(11,11) }, // ImGuiMouseCursor_Move
            { ImVec2(21,0), ImVec2( 9,23), ImVec2( 5,11) }, // ImGuiMouseCursor_ResizeNS
            { ImVec2(55,18),ImVec2(23, 9), ImVec2(11, 5) }, // ImGuiMouseCursor_ResizeEW
            { ImVec2(73,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNESW
            { ImVec2(55,0), ImVec2(17,17), ImVec2( 9, 9) }, // ImGuiMouseCursor_ResizeNWSE
        };

        for (int type = 0; type < ImGuiMouseCursor_Count_; type++)
        {
            ImGuiMouseCursorData& cursor_data = GImGui->MouseCursorData[type];
            ImVec2 pos = cursor_datas[type][0] + ImVec2((float)r.x, (float)r.y);
            const ImVec2 size = cursor_datas[type][1];
            cursor_data.Type = type;
            cursor_data.Size = size;
            cursor_data.HotOffset = cursor_datas[type][2];
            cursor_data.TexUvMin[0] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[0] = (pos + size) * tex_uv_scale;
            pos.x += TEX_DATA_W+1;
            cursor_data.TexUvMin[1] = (pos) * tex_uv_scale;
            cursor_data.TexUvMax[1] = (pos + size) * tex_uv_scale;
        }
    }
}